

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

int __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
close(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this,int __fd)

{
  int iVar1;
  
  iVar1 = asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::close
                    (&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,__fd)
  ;
  return iVar1;
}

Assistant:

std::error_code close(std::error_code& ec)
    {
        return socket_.lowest_layer().close(ec);
    }